

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbidata.cpp
# Opt level: O0

void __thiscall
icu_63::RBBIDataWrapper::RBBIDataWrapper
          (RBBIDataWrapper *this,RBBIDataHeader *data,EDontAdopt param_2,UErrorCode *status)

{
  UErrorCode *status_local;
  EDontAdopt param_2_local;
  RBBIDataHeader *data_local;
  RBBIDataWrapper *this_local;
  
  UnicodeString::UnicodeString(&this->fRuleString);
  init0(this);
  init(this,(EVP_PKEY_CTX *)data);
  this->fDontFreeData = '\x01';
  return;
}

Assistant:

RBBIDataWrapper::RBBIDataWrapper(const RBBIDataHeader *data, enum EDontAdopt, UErrorCode &status) {
    init0();
    init(data, status);
    fDontFreeData = TRUE;
}